

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  undefined8 object;
  bool bVar1;
  PropertyId propertyId_00;
  InlineCache *inlineCache_00;
  FunctionBody *functionBody;
  ScriptContext *requestContext;
  RecyclableObject *local_98;
  Var local_88;
  Var value;
  PropertyValueInfo info;
  RecyclableObject *obj;
  PropertyId propertyId;
  InlineCache *inlineCache;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  Var instance_local;
  InterpreterStackFrame *this_local;
  
  inlineCache_00 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  propertyId_00 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  bVar1 = VarIs<Js::RecyclableObject>(instance);
  if (bVar1) {
    local_98 = UnsafeVarTo<Js::RecyclableObject>(instance);
  }
  else {
    local_98 = (RecyclableObject *)0x0;
  }
  info._56_8_ = local_98;
  if (local_98 != (RecyclableObject *)0x0) {
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    functionBody = GetFunctionBody(this);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,functionBody,inlineCache_00,
               (uint)playout->inlineCacheIndex,true);
    object = info._56_8_;
    requestContext = GetScriptContext(this);
    bVar1 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      ((Var)object,false,(RecyclableObject *)object,propertyId_00,&local_88,
                       requestContext,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&value)
    ;
    if (bVar1) {
      SetReg<unsigned_short>(this,playout->Value,local_88);
      return;
    }
  }
  OP_GetProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
            (this,instance,playout);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetProperty(Var instance, unaligned T* playout)
    {
        InlineCache *inlineCache = GetInlineCache(playout->inlineCacheIndex);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        RecyclableObject* obj = JavascriptOperators::TryFromVar<RecyclableObject>(instance);
        if (obj)
        {
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);

            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &value, GetScriptContext(), nullptr, &info))
            {
                SetReg(playout->Value, value);
                return;
            }
        }
        OP_GetProperty_NoFastPath(instance, playout);
    }